

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ini_file::line_exist(xr_ini_file *this,char *sname,char *lname)

{
  pointer ppiVar1;
  ini_section *this_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  pointer ppiVar6;
  
  ppiVar6 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppiVar1 - (long)ppiVar6 >> 3;
  while (uVar2 = uVar5, 0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    iVar4 = strcasecmp((ppiVar6[uVar5]->name)._M_dataplus._M_p,sname);
    if (iVar4 < 0) {
      ppiVar6 = ppiVar6 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if (ppiVar6 != ppiVar1) {
    this_00 = *ppiVar6;
    iVar4 = strcasecmp((this_00->name)._M_dataplus._M_p,sname);
    if (iVar4 == 0) {
      bVar3 = ini_section::line_exist(this_00,lname,(char **)0x0);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool xr_ini_file::line_exist(const char* sname, const char* lname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0)
		return false;
	return (*it)->line_exist(lname, 0);
}